

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

void conditional_EBNF(Grammar *g)

{
  anon_struct_40_4_d8687ec6_for_rules *v;
  uint uVar1;
  Elem **ppEVar2;
  Rule **ppRVar3;
  Production *pPVar4;
  Rule *pRVar5;
  Elem *pEVar6;
  void *__s;
  undefined8 *puVar7;
  Rule **ppRVar8;
  
  pPVar4 = new_internal_production(g,g->p);
  pPVar4->field_0x3c = pPVar4->field_0x3c & 0xe3 | 8;
  pRVar5 = (Rule *)malloc(0xa8);
  memset(pRVar5,0,0xa8);
  pRVar5->prod = pPVar4;
  pEVar6 = (Elem *)malloc(0x20);
  pEVar6->kind = ELEM_NTERM;
  pEVar6->index = 0;
  pEVar6->rule = (Rule *)0x0;
  (pEVar6->e).nterm = (Production *)0x0;
  *(undefined8 *)((long)&pEVar6->e + 8) = 0;
  pRVar5->end = pEVar6;
  pEVar6->kind = ELEM_END;
  pEVar6->rule = pRVar5;
  pRVar5->action_index = g->action_index;
  ppEVar2 = (pRVar5->elems).v;
  if (ppEVar2 == (Elem **)0x0) {
    pEVar6 = (g->r->elems).v[(g->r->elems).n - 1];
    (pRVar5->elems).v = (pRVar5->elems).e;
    uVar1 = (pRVar5->elems).n;
    (pRVar5->elems).n = uVar1 + 1;
    (pRVar5->elems).e[uVar1] = pEVar6;
  }
  else {
    uVar1 = (pRVar5->elems).n;
    if (ppEVar2 == (pRVar5->elems).e) {
      if (2 < uVar1) goto LAB_0013b701;
      pEVar6 = (g->r->elems).v[(g->r->elems).n - 1];
    }
    else {
      if ((uVar1 & 7) == 0) {
LAB_0013b701:
        vec_add_internal(&pRVar5->elems,(g->r->elems).v[(g->r->elems).n - 1]);
        goto LAB_0013b71a;
      }
      pEVar6 = (g->r->elems).v[(g->r->elems).n - 1];
    }
    (pRVar5->elems).n = uVar1 + 1;
    ppEVar2[uVar1] = pEVar6;
  }
LAB_0013b71a:
  (g->r->elems).v[(g->r->elems).n - 1]->rule = pRVar5;
  (pRVar5->elems).v[(pRVar5->elems).n - 1]->rule = pRVar5;
  v = &pPVar4->rules;
  ppRVar3 = (pPVar4->rules).v;
  ppRVar8 = (pPVar4->rules).e;
  if (ppRVar3 == (Rule **)0x0) {
    (pPVar4->rules).v = ppRVar8;
    uVar1 = (pPVar4->rules).n;
    (pPVar4->rules).n = uVar1 + 1;
    (pPVar4->rules).e[uVar1] = pRVar5;
  }
  else {
    uVar1 = v->n;
    if (ppRVar3 == ppRVar8) {
      if (2 < uVar1) goto LAB_0013b791;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013b791:
      vec_add_internal(v,pRVar5);
      goto LAB_0013b79c;
    }
    v->n = uVar1 + 1;
    ppRVar3[uVar1] = pRVar5;
  }
LAB_0013b79c:
  ppRVar3 = (pPVar4->rules).v;
  if (ppRVar3 == (Rule **)0x0) {
    pRVar5 = (Rule *)malloc(0xa8);
    memset(pRVar5,0,0xa8);
    pRVar5->prod = pPVar4;
    pEVar6 = (Elem *)malloc(0x20);
    pEVar6->kind = ELEM_NTERM;
    pEVar6->index = 0;
    pEVar6->rule = (Rule *)0x0;
    (pEVar6->e).nterm = (Production *)0x0;
    *(undefined8 *)((long)&pEVar6->e + 8) = 0;
    pRVar5->end = pEVar6;
    pEVar6->kind = ELEM_END;
    pEVar6->rule = pRVar5;
    pRVar5->action_index = g->action_index;
    (pPVar4->rules).v = ppRVar8;
    uVar1 = (pPVar4->rules).n;
    (pPVar4->rules).n = uVar1 + 1;
    (pPVar4->rules).e[uVar1] = pRVar5;
    goto LAB_0013b8e9;
  }
  uVar1 = (pPVar4->rules).n;
  if (ppRVar3 == ppRVar8) {
    if (2 < uVar1) goto LAB_0013b88f;
  }
  else if ((uVar1 & 7) == 0) {
LAB_0013b88f:
    __s = malloc(0xa8);
    memset(__s,0,0xa8);
    *(Production **)((long)__s + 8) = pPVar4;
    puVar7 = (undefined8 *)malloc(0x20);
    *puVar7 = 0;
    puVar7[1] = 0;
    puVar7[2] = 0;
    puVar7[3] = 0;
    *(undefined8 **)((long)__s + 0x48) = puVar7;
    *(undefined4 *)puVar7 = 3;
    puVar7[1] = __s;
    *(int *)((long)__s + 0x98) = g->action_index;
    vec_add_internal(v,__s);
    goto LAB_0013b8e9;
  }
  pRVar5 = (Rule *)malloc(0xa8);
  memset(pRVar5,0,0xa8);
  pRVar5->prod = pPVar4;
  pEVar6 = (Elem *)malloc(0x20);
  pEVar6->kind = ELEM_NTERM;
  pEVar6->index = 0;
  pEVar6->rule = (Rule *)0x0;
  (pEVar6->e).nterm = (Production *)0x0;
  *(undefined8 *)((long)&pEVar6->e + 8) = 0;
  pRVar5->end = pEVar6;
  pEVar6->kind = ELEM_END;
  pEVar6->rule = pRVar5;
  pRVar5->action_index = g->action_index;
  uVar1 = (pPVar4->rules).n;
  (pPVar4->rules).n = uVar1 + 1;
  (pPVar4->rules).v[uVar1] = pRVar5;
LAB_0013b8e9:
  pRVar5 = g->r;
  pEVar6 = (Elem *)malloc(0x20);
  (pEVar6->e).nterm = (Production *)0x0;
  *(undefined8 *)((long)&pEVar6->e + 8) = 0;
  pEVar6->kind = ELEM_NTERM;
  pEVar6->index = 0;
  pEVar6->rule = (Rule *)0x0;
  (pEVar6->e).nterm = pPVar4;
  pEVar6->rule = pRVar5;
  (pRVar5->elems).v[(pRVar5->elems).n - 1] = pEVar6;
  return;
}

Assistant:

void conditional_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_CONDITIONAL;
  rr = new_rule(g, pp);
  vec_add(&rr->elems, last_elem(g->r));
  last_elem(g->r)->rule = rr;
  rr->elems.v[rr->elems.n - 1]->rule = rr;
  vec_add(&pp->rules, rr);
  vec_add(&pp->rules, new_rule(g, pp));
  last_elem(g->r) = new_elem_nterm(pp, g->r);
}